

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::Tokenizer::NextWithComments
          (Tokenizer *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  undefined1 uVar1;
  NextCommentStatus NVar2;
  CommentCollector collector;
  CommentCollector local_90;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_90.comment_buffer_._M_dataplus._M_p = (pointer)&local_90.comment_buffer_.field_2;
  local_90.comment_buffer_._M_string_length = 0;
  local_90.comment_buffer_.field_2._M_local_buf[0] = '\0';
  local_90.has_comment_ = false;
  local_90.is_line_comment_ = false;
  local_90.can_attach_to_prev_ = true;
  if (prev_trailing_comments != (string *)0x0) {
    prev_trailing_comments->_M_string_length = 0;
    *(prev_trailing_comments->_M_dataplus)._M_p = '\0';
  }
  local_90.prev_trailing_comments_ = prev_trailing_comments;
  local_90.detached_comments_ = detached_comments;
  local_90.next_leading_comments_ = next_leading_comments;
  if (detached_comments !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(detached_comments);
  }
  if (next_leading_comments != (string *)0x0) {
    next_leading_comments->_M_string_length = 0;
    *(next_leading_comments->_M_dataplus)._M_p = '\0';
  }
  if ((this->current_).type == TYPE_START) {
    if (this->current_char_ == -0x11) {
      NextChar(this);
      if ((this->current_char_ != -0x45) || (NextChar(this), this->current_char_ != -0x41)) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,
                   "Proto file starts with 0xEF but not UTF-8 BOM. Only UTF-8 is accepted for proto file."
                   ,"");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        anon_unknown_4::CommentCollector::~CommentCollector(&local_90);
        return false;
      }
      NextChar(this);
    }
    local_90.can_attach_to_prev_ = false;
    while (((ulong)(byte)this->current_char_ < 0x21 &&
           ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
      NextChar(this);
    }
    NVar2 = TryConsumeCommentStart(this);
    uVar1 = (*(code *)(&DAT_005686c8 + *(int *)(&DAT_005686c8 + (ulong)NVar2 * 4)))();
    return (bool)uVar1;
  }
  while (((ulong)(byte)this->current_char_ < 0x21 &&
         ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0))) {
    NextChar(this);
  }
  NVar2 = TryConsumeCommentStart(this);
  uVar1 = (*(code *)(&DAT_005686b8 + *(int *)(&DAT_005686b8 + (ulong)NVar2 * 4)))();
  return (bool)uVar1;
}

Assistant:

bool Tokenizer::NextWithComments(std::string* prev_trailing_comments,
                                 std::vector<std::string>* detached_comments,
                                 std::string* next_leading_comments) {
  CommentCollector collector(prev_trailing_comments, detached_comments,
                             next_leading_comments);

  if (current_.type == TYPE_START) {
    // Ignore unicode byte order mark(BOM) if it appears at the file
    // beginning. Only UTF-8 BOM (0xEF 0xBB 0xBF) is accepted.
    if (TryConsume((char)0xEF)) {
      if (!TryConsume((char)0xBB) || !TryConsume((char)0xBF)) {
        AddError(
            "Proto file starts with 0xEF but not UTF-8 BOM. "
            "Only UTF-8 is accepted for proto file.");
        return false;
      }
    }
    collector.DetachFromPrev();
  } else {
    // A comment appearing on the same line must be attached to the previous
    // declaration.
    ConsumeZeroOrMore<WhitespaceNoNewline>();
    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        ConsumeZeroOrMore<WhitespaceNoNewline>();
        if (!TryConsume('\n')) {
          // Oops, the next token is on the same line.  If we recorded a comment
          // we really have no idea which token it should be attached to.
          collector.ClearBuffer();
          return Next();
        }

        // Don't allow comments on subsequent lines to be attached to a trailing
        // comment.
        collector.Flush();
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (!TryConsume('\n')) {
          // The next token is on the same line.  There are no comments.
          return Next();
        }
        break;
    }
  }

  // OK, we are now on the line *after* the previous token.
  while (true) {
    ConsumeZeroOrMore<WhitespaceNoNewline>();

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(collector.GetBufferForLineComment());
        break;
      case BLOCK_COMMENT:
        ConsumeBlockComment(collector.GetBufferForBlockComment());

        // Consume the rest of the line so that we don't interpret it as a
        // blank line the next time around the loop.
        ConsumeZeroOrMore<WhitespaceNoNewline>();
        TryConsume('\n');
        break;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        if (TryConsume('\n')) {
          // Completely blank line.
          collector.Flush();
          collector.DetachFromPrev();
        } else {
          bool result = Next();
          if (!result || current_.text == "}" || current_.text == "]" ||
              current_.text == ")") {
            // It looks like we're at the end of a scope.  In this case it
            // makes no sense to attach a comment to the following token.
            collector.Flush();
          }
          return result;
        }
        break;
    }
  }
}